

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzarc3d.h
# Opt level: O0

void __thiscall
pzgeom::TPZArc3D::GradX<Fad<double>>
          (TPZArc3D *this,TPZFMatrix<double> *coord,TPZVec<Fad<double>_> *par,
          TPZFMatrix<Fad<double>_> *gradx)

{
  undefined1 uVar1;
  Fad<double> *this_00;
  Fad<double> *fadexpr;
  Fad<double> *e;
  Fad<double> *x;
  Fad<double> *x_00;
  TPZFMatrix<Fad<double>_> *in_RCX;
  long in_RDI;
  TPZManVector<Fad<double>,_10> *this_01;
  int j;
  Fad<double> scale;
  int i;
  Fad<double> Vtnorm;
  TPZManVector<Fad<double>,_10> middle;
  TPZManVector<Fad<double>,_10> OUTv;
  TPZManVector<Fad<double>,_10> Vt;
  TPZManVector<Fad<double>,_10> Vpb;
  TPZManVector<Fad<double>,_10> Vpa;
  TPZManVector<Fad<double>,_10> Vpc;
  double *in_stack_fffffffffffff128;
  Fad<double> *in_stack_fffffffffffff130;
  Fad<double> *in_stack_fffffffffffff138;
  Fad<double> *in_stack_fffffffffffff140;
  undefined7 in_stack_fffffffffffff148;
  undefined1 in_stack_fffffffffffff14f;
  TPZFMatrix<double> *in_stack_fffffffffffff150;
  Fad<double> *in_stack_fffffffffffff160;
  Fad<double> *in_stack_fffffffffffff168;
  Fad<double> *in_stack_fffffffffffff170;
  double in_stack_fffffffffffff178;
  Fad<double> *in_stack_fffffffffffff1d0;
  int64_t in_stack_fffffffffffff1d8;
  TPZManVector<Fad<double>,_10> *in_stack_fffffffffffff1e0;
  int local_d7c;
  int local_ccc;
  size_t in_stack_fffffffffffff548;
  char *in_stack_fffffffffffff550;
  TPZVec<Fad<double>_> *in_stack_fffffffffffff568;
  TPZVec<Fad<double>_> *in_stack_fffffffffffff570;
  TPZFMatrix<double> *in_stack_fffffffffffff578;
  TPZArc3D *in_stack_fffffffffffff580;
  TPZVec<Fad<double>_> local_7b0 [11];
  undefined8 local_650;
  TPZVec<Fad<double>_> local_628 [11];
  undefined8 local_4c8;
  TPZVec<Fad<double>_> local_4a0 [11];
  undefined8 local_340;
  TPZVec<Fad<double>_> local_318 [11];
  undefined8 local_1a8;
  TPZVec<Fad<double>_> local_180 [11];
  TPZFMatrix<Fad<double>_> *local_20;
  
  local_1a8 = 0;
  local_20 = in_RCX;
  Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffff140,&in_stack_fffffffffffff138->val_);
  TPZManVector<Fad<double>,_10>::TPZManVector
            (in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d0);
  Fad<double>::~Fad(in_stack_fffffffffffff130);
  local_340 = 0;
  Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffff140,&in_stack_fffffffffffff138->val_);
  TPZManVector<Fad<double>,_10>::TPZManVector
            (in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d0);
  Fad<double>::~Fad(in_stack_fffffffffffff130);
  local_4c8 = 0;
  Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffff140,&in_stack_fffffffffffff138->val_);
  TPZManVector<Fad<double>,_10>::TPZManVector
            (in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d0);
  Fad<double>::~Fad(in_stack_fffffffffffff130);
  local_650 = 0;
  Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffff140,&in_stack_fffffffffffff138->val_);
  TPZManVector<Fad<double>,_10>::TPZManVector
            (in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d0);
  Fad<double>::~Fad(in_stack_fffffffffffff130);
  Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffff140,&in_stack_fffffffffffff138->val_);
  TPZManVector<Fad<double>,_10>::TPZManVector
            (in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d0);
  Fad<double>::~Fad(in_stack_fffffffffffff130);
  Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffff140,&in_stack_fffffffffffff138->val_);
  TPZManVector<Fad<double>,_10>::TPZManVector
            (in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d0);
  Fad<double>::~Fad(in_stack_fffffffffffff130);
  X<Fad<double>>(in_stack_fffffffffffff580,in_stack_fffffffffffff578,in_stack_fffffffffffff570,
                 in_stack_fffffffffffff568);
  TPZFMatrix<double>::operator()
            (in_stack_fffffffffffff150,CONCAT17(in_stack_fffffffffffff14f,in_stack_fffffffffffff148)
             ,(int64_t)in_stack_fffffffffffff140);
  TPZVec<Fad<double>_>::operator[](local_7b0,0);
  operator-<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff178,in_stack_fffffffffffff170);
  TPZVec<Fad<double>_>::operator[](local_318,0);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff150,
             (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)
             CONCAT17(in_stack_fffffffffffff14f,in_stack_fffffffffffff148));
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff130);
  TPZFMatrix<double>::operator()
            (in_stack_fffffffffffff150,CONCAT17(in_stack_fffffffffffff14f,in_stack_fffffffffffff148)
             ,(int64_t)in_stack_fffffffffffff140);
  TPZVec<Fad<double>_>::operator[](local_7b0,1);
  operator-<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff178,in_stack_fffffffffffff170);
  TPZVec<Fad<double>_>::operator[](local_318,1);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff150,
             (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)
             CONCAT17(in_stack_fffffffffffff14f,in_stack_fffffffffffff148));
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff130);
  TPZFMatrix<double>::operator()
            (in_stack_fffffffffffff150,CONCAT17(in_stack_fffffffffffff14f,in_stack_fffffffffffff148)
             ,(int64_t)in_stack_fffffffffffff140);
  TPZVec<Fad<double>_>::operator[](local_7b0,2);
  operator-<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff178,in_stack_fffffffffffff170);
  TPZVec<Fad<double>_>::operator[](local_318,2);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff150,
             (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)
             CONCAT17(in_stack_fffffffffffff14f,in_stack_fffffffffffff148));
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff130);
  TPZFMatrix<double>::operator()
            (in_stack_fffffffffffff150,CONCAT17(in_stack_fffffffffffff14f,in_stack_fffffffffffff148)
             ,(int64_t)in_stack_fffffffffffff140);
  TPZVec<Fad<double>_>::operator[](local_7b0,0);
  operator-<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff178,in_stack_fffffffffffff170);
  TPZVec<Fad<double>_>::operator[](local_4a0,0);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff150,
             (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)
             CONCAT17(in_stack_fffffffffffff14f,in_stack_fffffffffffff148));
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff130);
  TPZFMatrix<double>::operator()
            (in_stack_fffffffffffff150,CONCAT17(in_stack_fffffffffffff14f,in_stack_fffffffffffff148)
             ,(int64_t)in_stack_fffffffffffff140);
  TPZVec<Fad<double>_>::operator[](local_7b0,1);
  operator-<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff178,in_stack_fffffffffffff170);
  TPZVec<Fad<double>_>::operator[](local_4a0,1);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff150,
             (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)
             CONCAT17(in_stack_fffffffffffff14f,in_stack_fffffffffffff148));
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff130);
  TPZFMatrix<double>::operator()
            (in_stack_fffffffffffff150,CONCAT17(in_stack_fffffffffffff14f,in_stack_fffffffffffff148)
             ,(int64_t)in_stack_fffffffffffff140);
  TPZVec<Fad<double>_>::operator[](local_7b0,2);
  operator-<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff178,in_stack_fffffffffffff170);
  TPZVec<Fad<double>_>::operator[](local_4a0,2);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff150,
             (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)
             CONCAT17(in_stack_fffffffffffff14f,in_stack_fffffffffffff148));
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff130);
  X<Fad<double>>(in_stack_fffffffffffff580,in_stack_fffffffffffff578,in_stack_fffffffffffff570,
                 in_stack_fffffffffffff568);
  TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0x1e0),0);
  TPZVec<Fad<double>_>::operator[](local_7b0,0);
  operator-<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff178,in_stack_fffffffffffff170);
  TPZVec<Fad<double>_>::operator[](local_180,0);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff150,
             (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)
             CONCAT17(in_stack_fffffffffffff14f,in_stack_fffffffffffff148));
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff130);
  TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0x1e0),1);
  TPZVec<Fad<double>_>::operator[](local_7b0,1);
  operator-<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff178,in_stack_fffffffffffff170);
  TPZVec<Fad<double>_>::operator[](local_180,1);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff150,
             (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)
             CONCAT17(in_stack_fffffffffffff14f,in_stack_fffffffffffff148));
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff130);
  TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0x1e0),2);
  TPZVec<Fad<double>_>::operator[](local_7b0,2);
  operator-<double,_Fad<double>,_nullptr>(in_stack_fffffffffffff178,in_stack_fffffffffffff170);
  TPZVec<Fad<double>_>::operator[](local_180,2);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff150,
             (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)
             CONCAT17(in_stack_fffffffffffff14f,in_stack_fffffffffffff148));
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffff130);
  TPZVec<Fad<double>_>::operator[](local_318,1);
  TPZVec<Fad<double>_>::operator[](local_4a0,0);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  TPZVec<Fad<double>_>::operator[](local_180,1);
  operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff168,
             in_stack_fffffffffffff160);
  TPZVec<Fad<double>_>::operator[](local_318,0);
  TPZVec<Fad<double>_>::operator[](local_4a0,1);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  TPZVec<Fad<double>_>::operator[](local_180,1);
  operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff168,
             in_stack_fffffffffffff160);
  operator-<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff168,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff160);
  TPZVec<Fad<double>_>::operator[](local_318,2);
  TPZVec<Fad<double>_>::operator[](local_4a0,0);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  TPZVec<Fad<double>_>::operator[](local_180,2);
  operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff168,
             in_stack_fffffffffffff160);
  operator+<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff168,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff160);
  TPZVec<Fad<double>_>::operator[](local_318,0);
  TPZVec<Fad<double>_>::operator[](local_4a0,2);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  TPZVec<Fad<double>_>::operator[](local_180,2);
  operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff168,
             in_stack_fffffffffffff160);
  operator-<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff168,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff160);
  TPZFMatrix<Fad<double>_>::operator()(local_20,0);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff150,
             (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)CONCAT17(in_stack_fffffffffffff14f,in_stack_fffffffffffff148));
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff130);
  TPZVec<Fad<double>_>::operator[](local_318,1);
  Fad<double>::operator-(in_stack_fffffffffffff138);
  TPZVec<Fad<double>_>::operator[](local_4a0,0);
  operator*<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadUnaryMin<Fad<double>_>_> *)in_stack_fffffffffffff168,
             in_stack_fffffffffffff160);
  TPZVec<Fad<double>_>::operator[](local_180,0);
  operator*<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *)
             in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  TPZVec<Fad<double>_>::operator[](local_318,0);
  TPZVec<Fad<double>_>::operator[](local_4a0,1);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  TPZVec<Fad<double>_>::operator[](local_180,0);
  operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff168,
             in_stack_fffffffffffff160);
  operator+<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff168,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff160);
  TPZVec<Fad<double>_>::operator[](local_318,2);
  TPZVec<Fad<double>_>::operator[](local_4a0,1);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  TPZVec<Fad<double>_>::operator[](local_180,2);
  operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff168,
             in_stack_fffffffffffff160);
  operator+<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff168,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff160);
  TPZVec<Fad<double>_>::operator[](local_318,1);
  TPZVec<Fad<double>_>::operator[](local_4a0,2);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  TPZVec<Fad<double>_>::operator[](local_180,2);
  operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff168,
             in_stack_fffffffffffff160);
  operator-<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff168,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff160);
  TPZFMatrix<Fad<double>_>::operator()(local_20,1);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff150,
             (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)CONCAT17(in_stack_fffffffffffff14f,in_stack_fffffffffffff148));
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
  ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *)
             in_stack_fffffffffffff130);
  FadExpr<FadUnaryMin<Fad<double>_>_>::~FadExpr((FadExpr<FadUnaryMin<Fad<double>_>_> *)0x17fc192);
  TPZVec<Fad<double>_>::operator[](local_318,2);
  Fad<double>::operator-(in_stack_fffffffffffff138);
  TPZVec<Fad<double>_>::operator[](local_4a0,0);
  operator*<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadUnaryMin<Fad<double>_>_> *)in_stack_fffffffffffff168,
             in_stack_fffffffffffff160);
  TPZVec<Fad<double>_>::operator[](local_180,0);
  operator*<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *)
             in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  this_00 = TPZVec<Fad<double>_>::operator[](local_318,0);
  TPZVec<Fad<double>_>::operator[](local_4a0,2);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  TPZVec<Fad<double>_>::operator[](local_180,0);
  operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff168,
             in_stack_fffffffffffff160);
  operator+<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff168,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff160);
  fadexpr = TPZVec<Fad<double>_>::operator[](local_318,2);
  TPZVec<Fad<double>_>::operator[](local_4a0,1);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  TPZVec<Fad<double>_>::operator[](local_180,1);
  operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff168,
             in_stack_fffffffffffff160);
  operator-<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff168,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff160);
  e = TPZVec<Fad<double>_>::operator[](local_318,1);
  TPZVec<Fad<double>_>::operator[](local_4a0,2);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffff168,in_stack_fffffffffffff160);
  TPZVec<Fad<double>_>::operator[](local_180,1);
  operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff168,
             in_stack_fffffffffffff160);
  operator+<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff168,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff160);
  x = TPZFMatrix<Fad<double>_>::operator()(local_20,2);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffff150,
             (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)CONCAT17(in_stack_fffffffffffff14f,in_stack_fffffffffffff148));
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
  ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *)
             in_stack_fffffffffffff130);
  FadExpr<FadUnaryMin<Fad<double>_>_>::~FadExpr((FadExpr<FadUnaryMin<Fad<double>_>_> *)0x17fc474);
  Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffff140,&in_stack_fffffffffffff138->val_);
  for (local_ccc = 0; local_ccc < 3; local_ccc = local_ccc + 1) {
    TPZVec<Fad<double>_>::operator[](local_628,(long)local_ccc);
    in_stack_fffffffffffff160 = (Fad<double> *)fabs<double>((Fad<double> *)0x17fc4cd);
    if ((double)in_stack_fffffffffffff160 < 1e-12) {
      TPZVec<Fad<double>_>::operator[](local_628,(long)local_ccc);
      Fad<double>::operator=<double,_nullptr>
                (in_stack_fffffffffffff140,&in_stack_fffffffffffff138->val_);
    }
    x_00 = TPZFMatrix<Fad<double>_>::operator()(local_20,(long)local_ccc);
    in_stack_fffffffffffff150 =
         (TPZFMatrix<double> *)TPZFMatrix<Fad<double>_>::operator()(local_20,(long)local_ccc);
    operator*<Fad<double>,_Fad<double>,_nullptr>(x,in_stack_fffffffffffff160);
    Fad<double>::operator+=
              (in_stack_fffffffffffff160,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)x_00);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff130);
  }
  uVar1 = operator<<double,_double,_nullptr>(in_stack_fffffffffffff130,in_stack_fffffffffffff128);
  if ((bool)uVar1) {
    pzinternal::DebugStopImpl(in_stack_fffffffffffff550,in_stack_fffffffffffff548);
  }
  this_01 = (TPZManVector<Fad<double>,_10> *)
            (*(double *)(in_RDI + 0x250) * *(double *)(in_RDI + 600));
  sqrt<double>(x);
  operator*<double,_FadExpr<FadFuncSqrt<Fad<double>_>_>,_nullptr>
            ((double)fadexpr,(FadExpr<FadFuncSqrt<Fad<double>_>_> *)e);
  operator/<double,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>,_nullptr>
            ((double)fadexpr,
             (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_> *)e);
  Fad<double>::
  Fad<FadBinaryDiv<FadCst<double>,FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadFuncSqrt<Fad<double>>>>>>>
            (this_00,(FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>_>_>
                      *)fadexpr);
  FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>_>_>
              *)in_stack_fffffffffffff130);
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_> *)
             in_stack_fffffffffffff130);
  FadExpr<FadFuncSqrt<Fad<double>_>_>::~FadExpr
            ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)in_stack_fffffffffffff130);
  for (local_d7c = 0; local_d7c < 3; local_d7c = local_d7c + 1) {
    TPZFMatrix<Fad<double>_>::operator()(local_20,(long)local_d7c);
    operator*<Fad<double>,_Fad<double>,_nullptr>(x,in_stack_fffffffffffff160);
    in_stack_fffffffffffff130 = TPZFMatrix<Fad<double>_>::operator()(local_20,(long)local_d7c);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_fffffffffffff150,
               (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)
               CONCAT17(uVar1,in_stack_fffffffffffff148));
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffff130);
  }
  Fad<double>::~Fad(in_stack_fffffffffffff130);
  Fad<double>::~Fad(in_stack_fffffffffffff130);
  TPZManVector<Fad<double>,_10>::~TPZManVector(this_01);
  TPZManVector<Fad<double>,_10>::~TPZManVector(this_01);
  TPZManVector<Fad<double>,_10>::~TPZManVector(this_01);
  TPZManVector<Fad<double>,_10>::~TPZManVector(this_01);
  TPZManVector<Fad<double>,_10>::~TPZManVector(this_01);
  TPZManVector<Fad<double>,_10>::~TPZManVector(this_01);
  return;
}

Assistant:

void GradX(TPZFMatrix<REAL> &coord, TPZVec<T> &par, TPZFMatrix<T> &gradx) const
        {
            
            /** Computing Axes */
            TPZManVector< T > Vpc(3,0.), Vpa(3,0.), Vpb(3,0.), Vt(3,0.), OUTv(3,0.);
            
            TPZManVector< T > middle(1, 0.);
            X(coord,middle,OUTv);
            
            /** Vector From MappedPoint to Ini */
            Vpa[0] = coord(0,0) - OUTv[0]; Vpa[1] = coord(1,0) - OUTv[1]; Vpa[2] = coord(2,0) - OUTv[2];
            
            /** Vector From MappedPoint to Fin */
            Vpb[0] = coord(0,1) - OUTv[0]; Vpb[1] = coord(1,1) - OUTv[1]; Vpb[2] = coord(2,1) - OUTv[2];
            
            X(coord,par,OUTv);
            
            /** Vector From MappedPoint to Center */
            Vpc[0] = fCenter3D[0] - OUTv[0]; Vpc[1] = fCenter3D[1] - OUTv[1]; Vpc[2] = fCenter3D[2] - OUTv[2];
            
            /** Tangent Vector From Point in the Arc */
            gradx(0) =  Vpa[1]*Vpb[0]*Vpc[1] - Vpa[0]*Vpb[1]*Vpc[1] + Vpa[2]*Vpb[0]*Vpc[2] - Vpa[0]*Vpb[2]*Vpc[2];
            gradx(1) = -Vpa[1]*Vpb[0]*Vpc[0] + Vpa[0]*Vpb[1]*Vpc[0] + Vpa[2]*Vpb[1]*Vpc[2] - Vpa[1]*Vpb[2]*Vpc[2];
            gradx(2) = -Vpa[2]*Vpb[0]*Vpc[0] + Vpa[0]*Vpb[2]*Vpc[0] - Vpa[2]*Vpb[1]*Vpc[1] + Vpa[1]*Vpb[2]*Vpc[1];
            
            T Vtnorm = 0.;
            for(int i = 0; i < 3; i++)
            {
                if( fabs(Vt[i]) < 1.E-12 ) Vt[i] = 0.;
                Vtnorm += gradx(i)*gradx(i);
            }
            if(Vtnorm < 0.) DebugStop();
//            if(sqrt(Vtnorm) < 1e-16) DebugStop();
            T scale = fAngle*fRadius/(2.*sqrt(Vtnorm));
            for(int j = 0; j < 3; j++) gradx(j) = gradx(j)*scale;

        }